

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::Misbehaving
          (PeerManagerImpl *this,Peer *peer,string *message)

{
  string_view logging_function;
  bool bVar1;
  LogFlags in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock37;
  string message_prefixed;
  Level in_stack_000000d0;
  long *in_stack_000000e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  int source_line;
  allocator<char> local_39 [17];
  ConstevalFormatString<2U> in_stack_ffffffffffffffd8;
  string_view in_stack_ffffffffffffffe0;
  size_t in_stack_fffffffffffffff0;
  char *pcVar2;
  
  source_line = (int)((ulong)in_RDI >> 0x20);
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,
             (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             SUB41((uint)in_stack_ffffffffffffff48 >> 0x18,0));
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
              );
    std::allocator<char>::~allocator(local_39);
  }
  else {
    std::operator+((char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  *(undefined1 *)(in_RSI + (WALLETDB|HTTP)) = 1;
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff28 = 1;
    logging_function._M_str = pcVar2;
    logging_function._M_len = in_stack_fffffffffffffff0;
    LogPrintFormatInternal<long,std::__cxx11::string>
              (logging_function,in_stack_ffffffffffffffe0,source_line,in_RSI,in_stack_000000d0,
               in_stack_ffffffffffffffd8,in_stack_000000e0,in_stack_000000e8);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::Misbehaving(Peer& peer, const std::string& message)
{
    LOCK(peer.m_misbehavior_mutex);

    const std::string message_prefixed = message.empty() ? "" : (": " + message);
    peer.m_should_discourage = true;
    LogDebug(BCLog::NET, "Misbehaving: peer=%d%s\n", peer.m_id, message_prefixed);
}